

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getFieldFromAcroForm(QPDFFormFieldObjectHelper *this,string *name)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [24];
  QPDFObjectHandle acroform;
  undefined1 local_48 [24];
  QPDF *q;
  QPDFObjectHandle result;
  string *name_local;
  QPDFFormFieldObjectHelper *this_local;
  
  QPDFObjectHandle::newNull();
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_48);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  local_48._16_8_ = p_Var2;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)&q);
    acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
  }
  else {
    QPDF::getRoot((QPDF *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,"/AcroForm",&local_99);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_78 + 0x10),(string *)local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_78 + 0x10));
    if (bVar1) {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)(local_78 + 0x10));
    }
    else {
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)&q);
    }
    acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_78 + 0x10));
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&q);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getFieldFromAcroForm(std::string const& name)
{
    QPDFObjectHandle result = QPDFObjectHandle::newNull();
    // Fields are supposed to be indirect, so this should work.
    QPDF* q = oh().getOwningQPDF();
    if (!q) {
        return result;
    }
    auto acroform = q->getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        return result;
    }
    return acroform.getKey(name);
}